

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

int __thiscall testing::internal::ForkingDeathTest::Wait(ForkingDeathTest *this)

{
  __pid_t _Var1;
  int iVar2;
  int *piVar3;
  long *plVar4;
  long *plVar5;
  size_type *psVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  undefined1 *local_120 [2];
  undefined1 local_110 [16];
  string local_100;
  long *local_e0;
  long local_d8;
  long local_d0;
  long lStack_c8;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  int local_7c;
  string local_78;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  int local_34 [2];
  int status_value;
  
  iVar2 = 0;
  if ((this->super_DeathTestImpl).spawned_ == true) {
    DeathTestImpl::ReadAndInterpretStatusByte(&this->super_DeathTestImpl);
    while( true ) {
      _Var1 = waitpid(*(__pid_t *)&(this->super_DeathTestImpl).field_0x3c,local_34,0);
      if (_Var1 != -1) break;
      piVar3 = __errno_location();
      if (*piVar3 != 4) {
        local_120[0] = local_110;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_120,"CHECK failed: File ","");
        plVar4 = (long *)std::__cxx11::string::append((char *)local_120);
        local_c0 = (long *)*plVar4;
        plVar5 = plVar4 + 2;
        if (local_c0 == plVar5) {
          local_b0 = *plVar5;
          lStack_a8 = plVar4[3];
          local_c0 = &local_b0;
        }
        else {
          local_b0 = *plVar5;
        }
        local_b8 = plVar4[1];
        *plVar4 = (long)plVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_c0);
        local_a0._M_dataplus._M_p = (pointer)*plVar4;
        psVar6 = (size_type *)(plVar4 + 2);
        if ((size_type *)local_a0._M_dataplus._M_p == psVar6) {
          local_a0.field_2._M_allocated_capacity = *psVar6;
          local_a0.field_2._8_8_ = plVar4[3];
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        }
        else {
          local_a0.field_2._M_allocated_capacity = *psVar6;
        }
        local_a0._M_string_length = plVar4[1];
        *plVar4 = (long)psVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        local_7c = 0x43b;
        StreamableToString<int>(&local_100,&local_7c);
        std::operator+(&local_140,&local_a0,&local_100);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_140);
        local_e0 = (long *)*plVar4;
        plVar5 = plVar4 + 2;
        if (local_e0 == plVar5) {
          local_d0 = *plVar5;
          lStack_c8 = plVar4[3];
          local_e0 = &local_d0;
        }
        else {
          local_d0 = *plVar5;
        }
        local_d8 = plVar4[1];
        *plVar4 = (long)plVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_e0);
        local_58 = (long *)*plVar4;
        plVar5 = plVar4 + 2;
        if (local_58 == plVar5) {
          local_48 = *plVar5;
          lStack_40 = plVar4[3];
          local_58 = &local_48;
        }
        else {
          local_48 = *plVar5;
        }
        local_50 = plVar4[1];
        *plVar4 = (long)plVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_58);
        local_78._M_dataplus._M_p = (pointer)*plVar4;
        psVar6 = (size_type *)(plVar4 + 2);
        if ((size_type *)local_78._M_dataplus._M_p == psVar6) {
          local_78.field_2._M_allocated_capacity = *psVar6;
          local_78.field_2._8_8_ = plVar4[3];
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        }
        else {
          local_78.field_2._M_allocated_capacity = *psVar6;
        }
        local_78._M_string_length = plVar4[1];
        *plVar4 = (long)psVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        DeathTestAbort(&local_78);
      }
    }
    (this->super_DeathTestImpl).status_ = local_34[0];
    iVar2 = local_34[0];
  }
  return iVar2;
}

Assistant:

int ForkingDeathTest::Wait() {
  if (!spawned()) return 0;

  ReadAndInterpretStatusByte();

  int status_value;
  GTEST_DEATH_TEST_CHECK_SYSCALL_(waitpid(child_pid_, &status_value, 0));
  set_status(status_value);
  return status_value;
}